

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

void Gli_ManSwitchesAndGlitches(Gli_Man_t *p,int nPatterns,float PiTransProb,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  int nIters;
  abctime clk;
  int local_20;
  int k;
  int i;
  int fVerbose_local;
  float PiTransProb_local;
  int nPatterns_local;
  Gli_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  Gia_ManRandom(1);
  Gli_ManFinalize(p);
  if (p->nRegs == 0) {
    for (local_20 = 0; local_20 < nPatterns; local_20 = local_20 + 1) {
      Gli_ManSetPiRandom(p,PiTransProb);
      Gli_ManSwitching(p);
      Gli_ManGlitching(p);
    }
  }
  else {
    iVar1 = Abc_BitWordNum(nPatterns);
    Gli_ManSimulateSeqPref(p,0x10);
    for (local_20 = 0; local_20 < 0x20; local_20 = local_20 + 1) {
      Gli_ManSetDataSaved(p,local_20);
      for (clk._4_4_ = 0; clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
        Gli_ManSetPiRandomSeq(p,PiTransProb);
        Gli_ManSwitching(p);
        Gli_ManGlitching(p);
      }
    }
  }
  if (fVerbose != 0) {
    printf("Simulated %d patterns.  Input transition probability %.2f.  ",(double)PiTransProb,
           (ulong)(uint)nPatterns);
    Abc_Print(1,"%s =","Memory");
    Abc_Print(1,"%10.3f MB  ",((double)(p->nObjData << 2) * 1.0) / 1048576.0);
    Abc_Print(1,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar2) * 1.0) / 1000000.0);
  }
  return;
}

Assistant:

void Gli_ManSwitchesAndGlitches( Gli_Man_t * p, int nPatterns, float PiTransProb, int fVerbose )
{
    int i, k;
    abctime clk = Abc_Clock();
    Gia_ManRandom( 1 );
    Gli_ManFinalize( p );
    if ( p->nRegs == 0 )
    {
        for ( i = 0; i < nPatterns; i++ )
        {
            Gli_ManSetPiRandom( p, PiTransProb );
            Gli_ManSwitching( p );
            Gli_ManGlitching( p );
//            Gli_ManVerify( p );
        }
    }
    else 
    {
        int nIters = Abc_BitWordNum(nPatterns);
        Gli_ManSimulateSeqPref( p, 16 );
        for ( i = 0; i < 32; i++ )
        {
            Gli_ManSetDataSaved( p, i );
            for ( k = 0; k < nIters; k++ )
            {
                Gli_ManSetPiRandomSeq( p, PiTransProb );
                Gli_ManSwitching( p );
                Gli_ManGlitching( p );
//                Gli_ManVerify( p );
            }
        }
    }
    if ( fVerbose )
    {
        printf( "Simulated %d patterns.  Input transition probability %.2f.  ", nPatterns, PiTransProb );
        ABC_PRMn( "Memory", 4*p->nObjData );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
}